

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O3

ulong __thiscall nuraft::raft_server::create_snapshot(raft_server *this)

{
  ulong committed_idx;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  string local_40;
  
  committed_idx = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar3 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar3) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_40,"manually create a snapshot on %lu",committed_idx);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"create_snapshot",0x1d4,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
  }
  bVar2 = snapshot_and_compact(this,committed_idx,true);
  uVar4 = 0;
  if (bVar2) {
    uVar4 = committed_idx;
  }
  return uVar4;
}

Assistant:

ulong raft_server::create_snapshot() {
    uint64_t committed_idx = sm_commit_index_;
    p_in("manually create a snapshot on %" PRIu64 "", committed_idx);
    return snapshot_and_compact(committed_idx, true) ? committed_idx : 0;
}